

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

void __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::ClearAll
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this)

{
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *buffer;
  DictionaryStats *pDVar3;
  uint bucketCount;
  ulong uVar4;
  
  bucketCount = this->tableSize;
  if (bucketCount == 0) {
    bucketCount = 0;
  }
  else {
    uVar4 = 0;
    do {
      pSVar1 = this->table + uVar4;
      buffer = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
               this->table[uVar4].super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (buffer != pSVar1) {
        this_00 = &this->alloc->
                   super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
        do {
          pSVar2 = (SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *)
                   (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    (this_00,buffer,0x20);
          buffer = pSVar2;
        } while (pSVar2 != pSVar1);
        bucketCount = this->tableSize;
      }
      (pSVar1->super_SListNodeBase<Memory::ArenaAllocator>).next =
           &pSVar1->super_SListNodeBase<Memory::ArenaAllocator>;
      (pSVar1->super_RealCount).count = 0;
      uVar4 = uVar4 + 1;
    } while (uVar4 < bucketCount);
  }
  pDVar3 = DictionaryStats::Create
                     ("P9HashTableI18ObjTypeGuardBucketN6Memory14ArenaAllocatorEE",bucketCount);
  this->stats = pDVar3;
  return;
}

Assistant:

void ClearAll()
    {
        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].Clear(this->alloc);
        }
#if PROFILE_DICTIONARY
        // To not lose previously collected data, we will treat cleared dictionary as a separate instance for stats tracking purpose
        stats = DictionaryStats::Create(typeid(this).name(), tableSize);
#endif
    }